

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

void __thiscall
ResourceCopierTask::ResourceCopierTask
          (ResourceCopierTask *this,PDFFormXObject *inFormXObject,PDFDocumentHandler *inCopier,
          PDFObject *inObjectToCopy)

{
  (this->super_IResourceWritingTask)._vptr_IResourceWritingTask =
       (_func_int **)&PTR__ResourceCopierTask_003703c0;
  (this->mResourceName)._M_dataplus._M_p = (pointer)&(this->mResourceName).field_2;
  (this->mResourceName)._M_string_length = 0;
  (this->mResourceName).field_2._M_local_buf[0] = '\0';
  this->mCopier = inCopier;
  this->mObjectToCopy = inObjectToCopy;
  RefCountObject::AddRef(&inObjectToCopy->super_RefCountObject);
  this->mFormXObject = inFormXObject;
  return;
}

Assistant:

ResourceCopierTask(PDFFormXObject* inFormXObject,PDFDocumentHandler* inCopier,PDFObject* inObjectToCopy)
    {
        mCopier = inCopier;
        mObjectToCopy = inObjectToCopy;
        mObjectToCopy->AddRef();
        mFormXObject = inFormXObject;
    }